

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O2

void __thiscall
bhf::ParameterList::ParameterList(ParameterList *this,initializer_list<bhf::ParameterOption> list)

{
  _Rb_tree_header *p_Var1;
  ParameterOption *pPVar2;
  long lVar3;
  ParameterOption p;
  ParameterOption PStack_68;
  
  pPVar2 = list._M_array;
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (lVar3 = list._M_len * 0x48; lVar3 != 0; lVar3 = lVar3 + -0x48) {
    ParameterOption::ParameterOption(&PStack_68,pPVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ParameterOption>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,bhf::ParameterOption&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ParameterOption>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>>
                *)this,&PStack_68.key,&PStack_68);
    ParameterOption::~ParameterOption(&PStack_68);
    pPVar2 = pPVar2 + 1;
  }
  return;
}

Assistant:

ParameterList(std::initializer_list<ParameterOption> list)
    {
        for (auto p: list) {
            map.emplace(p.key, p);
        }
    }